

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O2

void describeEdge(Edge *e)

{
  printf("Edge structure stored at %p.\n\t- Index:                      %d\n\t- Origin index:               %d\n\t- Destination index:          %d\n\t- Discarded?:                 %d\n"
         ,e,(ulong)(uint)e->idx,(ulong)(uint)e->orig,(ulong)(uint)e->dest,(ulong)(uint)e->discarded)
  ;
  return;
}

Assistant:

void describeEdge(Edge *e) {

	printf("Edge structure stored at %p.\n"
		   "\t- Index:                      %d\n"
		   "\t- Origin index:               %d\n"
		   "\t- Destination index:          %d\n"
		   "\t- Discarded?:                 %d\n",
		   e,
		   e->idx, e->orig, e->dest,
	   	   e->discarded);
}